

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_mix_2_0_to_5_1(mixed_segment *segment)

{
  undefined8 *puVar1;
  uint32_t i;
  ulong uVar2;
  float fVar3;
  uint32_t frames;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float *lfe;
  float *ce;
  float *rr;
  float *rl;
  float *fr;
  float *fl;
  float *r;
  float *l;
  
  puVar1 = (undefined8 *)segment->data;
  frames = 0xffffffff;
  mixed_buffer_request_read(&l,&frames,(mixed_buffer *)*puVar1);
  mixed_buffer_request_read(&r,&frames,(mixed_buffer *)puVar1[1]);
  mixed_buffer_request_write(&fl,&frames,(mixed_buffer *)puVar1[0xe]);
  mixed_buffer_request_write(&fr,&frames,(mixed_buffer *)puVar1[0xf]);
  mixed_buffer_request_write(&rl,&frames,(mixed_buffer *)puVar1[0x10]);
  mixed_buffer_request_write(&rr,&frames,(mixed_buffer *)puVar1[0x11]);
  mixed_buffer_request_write(&ce,&frames,(mixed_buffer *)puVar1[0x12]);
  mixed_buffer_request_write(&lfe,&frames,(mixed_buffer *)puVar1[0x13]);
  for (uVar2 = 0; uVar2 < frames; uVar2 = uVar2 + 1) {
    local_6c = l[uVar2];
    local_68 = r[uVar2];
    local_70 = (local_6c + local_68) * 0.5;
    local_64 = biquad_sample(local_70,(biquad_data *)((long)puVar1 + 0xe4));
    fVar3 = biquad_sample(local_70,(biquad_data *)(puVar1 + 0x21));
    fl[uVar2] = local_6c;
    fr[uVar2] = local_68;
    rl[uVar2] = (local_70 * -0.5 + local_6c + local_6c) * 0.571;
    rr[uVar2] = (local_70 * -0.5 + local_68 + local_68) * 0.571;
    ce[uVar2] = local_64;
    lfe[uVar2] = fVar3;
  }
  mixed_buffer_finish_read(frames,(mixed_buffer *)*puVar1);
  mixed_buffer_finish_read(frames,(mixed_buffer *)puVar1[1]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0xe]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0xf]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0x10]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0x11]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0x12]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0x13]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_5_1(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict rl, *restrict rr, *restrict ce, *restrict lfe;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&rl, &frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_request_write(&rr, &frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_request_write(&ce, &frames, data->out[MIXED_CENTER]);
  mixed_buffer_request_write(&lfe, &frames, data->out[MIXED_SUBWOOFER]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];

    float c = (li+ri)*0.5f;
    float ci = biquad_sample(c, &data->lp[0]);
    float lfei = biquad_sample(c, &data->lp[1]);
    float rli = 0.571f * (li + (li - 0.5f * c));
    float rri = 0.571f * (ri + (ri - 0.5f * c));

    // FIXME: Hilbert is fucked. Reinstate when it works again.
    /* float r = biquad_sample(s, &data->lp[2]); */
    /* // 90 deg hilbert phase shift. This "automatically" induces a delay as well. */
    /* float rri = hilbert(r, delay, delay_size, delay_i); */
    /* delay_i = (delay_i+1) % delay_size; */
    /* float rli = -rri; */

    fl[i] = li;
    fr[i] = ri;
    rl[i] = rli;
    rr[i] = rri;
    ce[i] = ci;
    lfe[i] = lfei;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_CENTER]);
  mixed_buffer_finish_write(frames, data->out[MIXED_SUBWOOFER]);

  return 1;
}